

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgproc-benchmark.cpp
# Opt level: O3

void __thiscall ProgramOptions::run(ProgramOptions *this)

{
  undefined8 this_00;
  undefined8 this_01;
  long lVar1;
  long lVar2;
  ostream *poVar3;
  long *plVar4;
  Image *pIVar5;
  shared_ptr<Image> img;
  undefined1 local_80 [16];
  undefined1 local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Image::fromPNG((Image *)(local_70 + 0x10),&this->input_file);
  lVar1 = std::chrono::_V2::system_clock::now();
  runWaterEffect((Image *)local_80,(WaterEffectOptions *)local_70._16_8_);
  this_01 = local_80._8_8_;
  this_00 = local_80._0_8_;
  lVar2 = std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Full pipeline (baseline): ",0x1a);
  poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - lVar1) * 1e-09);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," s.",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((Image *)this_00 != (Image *)0x0) {
    std::operator+(&local_50,"output/",&(this->water_opts).img_name);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    pIVar5 = (Image *)(plVar4 + 2);
    if ((Image *)*plVar4 == pIVar5) {
      local_70._0_8_ = pIVar5->pixels;
      local_70._8_8_ = plVar4[3];
      local_80._0_8_ = (Image *)local_70;
    }
    else {
      local_70._0_8_ = pIVar5->pixels;
      local_80._0_8_ = (Image *)*plVar4;
    }
    local_80._8_8_ = plVar4[1];
    *plVar4 = (long)pIVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    Image::toPNG((Image *)this_00,(string *)local_80);
    if ((Image *)local_80._0_8_ != (Image *)local_70) {
      operator_delete((void *)local_80._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  if (this->cuda == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Project was built without CUDA support.\nSkipping CUDA pipeline and test.",0x48);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._24_8_);
  }
  return;
}

Assistant:

void run() {
    // Load the image.
    auto img = Image::fromPNG(input_file);
    std::shared_ptr<Image> img_baseline_result;

    Timer tt;

    // Start the total pipeline measurement.
    tt.start();
    img_baseline_result = runWaterEffect(img.get(), &water_opts);
    // Stop the timer for the baseline pipeline.
    tt.stop();
    std::cout << "Full pipeline (baseline): " << tt.seconds() << " s." << std::endl;


    // Save the final result if any image was produced
    if (img_baseline_result != nullptr) {
      img_baseline_result->toPNG("output/" + water_opts.img_name + "_result.png");
    }

    // Run the whole pipeline using CUDA
    if (cuda) {
#ifdef USE_CUDA
      tt.start();
      auto img_cuda_result = runWaterEffectCUDA(img.get(), &water_opts);
      tt.stop();
      std::cout << "Full pipeline (CUDA):     " << tt.seconds() << " s." << std::endl;

      if (img_cuda_result != nullptr) {
        img_cuda_result->toPNG("output/" + water_opts.img_name + "_result.png");
      } else {
        std::cerr << "CUDA water effect returned nullptr. Cannot output PNG." << std::endl;
      }

      // Compare the CUDA implementation to the baseline if testing is enabled
      if (test) {
        if (img_cuda_result != nullptr) {
          if (img_cuda_result->is_approximately_equal_to(img_baseline_result.get())) {
            std::cout << "Test passed." << std::endl;
          } else {
            std::cout << "Test failed." << std::endl;
          }
        } else {
          std::cerr << "CUDA water effect returned nullptr. Cannot test approximate equality." << std::endl;
        }
      }
#else
      std::cout << "Project was built without CUDA support.\n"
                   "Skipping CUDA pipeline and test." << std::endl;
#endif
    }
  }